

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.cpp
# Opt level: O0

ostream * wasm::operator<<(ostream *o,WasmException *exn)

{
  element_type *peVar1;
  ostream *poVar2;
  char *in_RCX;
  Name name;
  Literals local_80;
  ostream *local_38;
  char *pcStack_30;
  shared_ptr<wasm::ExnData> exnData;
  WasmException *exn_local;
  ostream *o_local;
  
  exnData.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)exn;
  Literal::getExnData((Literal *)&stack0xffffffffffffffd8);
  peVar1 = std::__shared_ptr_access<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&stack0xffffffffffffffd8);
  local_38 = (ostream *)(peVar1->tag).super_IString.str._M_len;
  pcStack_30 = (peVar1->tag).super_IString.str._M_str;
  name.super_IString.str._M_str = in_RCX;
  name.super_IString.str._M_len = (size_t)pcStack_30;
  poVar2 = operator<<((wasm *)o,local_38,name);
  poVar2 = std::operator<<(poVar2," ");
  peVar1 = std::__shared_ptr_access<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&stack0xffffffffffffffd8);
  Literals::Literals(&local_80,&peVar1->payload);
  poVar2 = operator<<(poVar2,&local_80);
  Literals::~Literals(&local_80);
  std::shared_ptr<wasm::ExnData>::~shared_ptr((shared_ptr<wasm::ExnData> *)&stack0xffffffffffffffd8)
  ;
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& o, const WasmException& exn) {
  auto exnData = exn.exn.getExnData();
  return o << exnData->tag << " " << exnData->payload;
}